

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<signed_char>
          (OutOfRangeException *this,string *msg,char params)

{
  undefined8 in_RSI;
  string *in_RDI;
  string local_38 [47];
  
  Exception::ConstructMessage<signed_char>(in_RDI,(char)((ulong)in_RSI >> 0x38));
  duckdb::OutOfRangeException::OutOfRangeException((OutOfRangeException *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}